

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  float *pfVar5;
  float *pfVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float *outptr;
  Option opt_g;
  long local_138;
  Mat local_f0;
  undefined1 local_a8 [16];
  void *local_98;
  long local_90;
  InnerProduct *local_88;
  void *local_80;
  Option local_78;
  
  uVar9 = this->weight_data_size / this->num_output;
  uVar1 = bottom_blob->c;
  local_f0.elemsize = bottom_blob->elemsize;
  local_f0.data = bottom_blob->data;
  local_f0.refcount = bottom_blob->refcount;
  local_f0.elempack = bottom_blob->elempack;
  local_f0.allocator = bottom_blob->allocator;
  local_f0.dims = bottom_blob->dims;
  local_f0.w = bottom_blob->w;
  local_f0.h = bottom_blob->h;
  local_f0.d = bottom_blob->d;
  uVar2 = bottom_blob->w;
  uVar17 = bottom_blob->h;
  local_f0.cstep = bottom_blob->cstep;
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + 1;
    UNLOCK();
  }
  local_f0.c = uVar1;
  if (local_f0.elemsize != 1) {
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    uVar22._0_1_ = opt->use_bf16_storage;
    uVar22._1_1_ = opt->use_fp16_packed;
    uVar22._2_1_ = opt->use_fp16_storage;
    uVar22._3_1_ = opt->use_fp16_arithmetic;
    uVar22._4_1_ = opt->use_int8_packed;
    uVar22._5_1_ = opt->use_int8_storage;
    uVar22._6_1_ = opt->use_int8_arithmetic;
    uVar22._7_1_ = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_reserved_1 = opt->use_reserved_1;
    local_78.use_reserved_2 = opt->use_reserved_2;
    local_78.use_reserved_3 = opt->use_reserved_3;
    local_78.use_reserved_4 = opt->use_reserved_4;
    local_78.use_reserved_5 = opt->use_reserved_5;
    local_78.use_reserved_6 = opt->use_reserved_6;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    local_78._32_8_ = uVar22 & 0xffffffffffffff;
    quantize_to_int8(bottom_blob,&local_f0,&this->bottom_blob_int8_scales,&local_78);
  }
  if (bottom_blob->dims == 2) {
    iVar18 = this->num_output;
    if ((int)uVar17 < 2 || uVar2 != uVar9) goto LAB_001d0b9e;
    Mat::create(top_blob,iVar18,uVar17,4,opt->blob_allocator);
    auVar8 = local_a8;
    local_80 = top_blob->data;
    iVar18 = -100;
    if ((local_80 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_001d0e40;
    local_90 = (long)top_blob->w * top_blob->elemsize;
    uVar1 = this->num_output;
    iVar18 = this->bias_term;
    local_98 = (this->weight_data).data;
    pvVar4 = (this->weight_data_int8_scales).data;
    iVar3 = this->activation_type;
    local_a8._4_4_ = 0;
    local_a8._0_4_ = uVar17;
    local_a8._8_8_ = auVar8._8_8_;
    lVar10 = (long)local_f0.w * local_f0.elemsize;
    local_138 = 0;
    pvVar20 = local_f0.data;
    local_88 = this;
    do {
      pvVar15 = local_80;
      if (0 < (int)uVar1) {
        lVar16 = local_90 * local_138;
        pfVar5 = (float *)(local_88->bottom_blob_int8_scales).data;
        pfVar6 = (float *)(local_88->activation_params).data;
        pvVar7 = (local_88->bias_data).data;
        uVar22 = 0;
        pvVar21 = local_98;
        do {
          fVar25 = 0.0;
          fVar23 = 0.0;
          if (0 < (int)uVar9) {
            uVar11 = 0;
            iVar12 = 0;
            do {
              iVar12 = iVar12 + (int)*(char *)((long)pvVar21 + uVar11) *
                                (int)*(char *)((long)pvVar20 + uVar11);
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
            fVar23 = (float)iVar12;
          }
          fVar26 = *(float *)((long)pvVar4 + uVar22 * 4);
          if (fVar26 != 0.0) {
            fVar25 = 1.0 / (fVar26 * *pfVar5);
          }
          fVar25 = fVar25 * fVar23;
          if (iVar18 != 0) {
            fVar25 = fVar25 + *(float *)((long)pvVar7 + uVar22 * 4);
          }
          fVar23 = fVar25;
          switch(iVar3) {
          case 1:
            if (fVar25 <= 0.0) {
              fVar23 = 0.0;
            }
            break;
          case 2:
            fVar23 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar6 |
                            -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
            break;
          case 3:
            if (fVar25 <= *pfVar6) {
              fVar25 = *pfVar6;
            }
            fVar23 = fVar25;
            if (pfVar6[1] <= fVar25) {
              fVar23 = pfVar6[1];
            }
            break;
          case 4:
            fVar23 = expf(-fVar25);
            fVar23 = 1.0 / (fVar23 + 1.0);
            break;
          case 5:
            fVar23 = expf(fVar25);
            fVar23 = logf(fVar23 + 1.0);
            fVar23 = tanhf(fVar23);
            fVar23 = fVar23 * fVar25;
            break;
          case 6:
            fVar26 = *pfVar6;
            fVar24 = -pfVar6[1] / fVar26;
            fVar23 = 0.0;
            if ((fVar24 <= fVar25) && (fVar23 = fVar25, fVar25 <= fVar24 + 1.0 / fVar26)) {
              fVar23 = (fVar26 * fVar25 + pfVar6[1]) * fVar25;
            }
          }
          *(float *)((long)pvVar15 + uVar22 * 4 + lVar16) = fVar23;
          uVar22 = uVar22 + 1;
          pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar9);
        } while (uVar22 != uVar1);
      }
      local_138 = local_138 + 1;
      pvVar20 = (void *)((long)pvVar20 + lVar10);
    } while (local_138 != local_a8._0_8_);
  }
  else {
    iVar18 = this->num_output;
LAB_001d0b9e:
    Mat::create(top_blob,iVar18,4,opt->blob_allocator);
    pvVar20 = local_f0.data;
    pvVar4 = top_blob->data;
    iVar18 = -100;
    if ((pvVar4 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_001d0e40;
    iVar18 = this->num_output;
    if (0 < (long)iVar18) {
      uVar17 = uVar17 * uVar2;
      pvVar15 = (this->weight_data).data;
      pvVar7 = (this->weight_data_int8_scales).data;
      pfVar5 = (float *)(this->bottom_blob_int8_scales).data;
      iVar3 = this->bias_term;
      iVar12 = this->activation_type;
      pvVar21 = (this->bias_data).data;
      pfVar6 = (float *)(this->activation_params).data;
      lVar10 = local_f0.cstep * local_f0.elemsize;
      lVar16 = 0;
      do {
        fVar23 = 0.0;
        if (0 < (int)uVar1) {
          uVar22 = 0;
          iVar19 = 0;
          pvVar13 = pvVar20;
          pvVar14 = pvVar15;
          do {
            if (0 < (int)uVar17) {
              uVar11 = 0;
              do {
                iVar19 = iVar19 + (int)*(char *)((long)pvVar14 + uVar11) *
                                  (int)*(char *)((long)pvVar13 + uVar11);
                uVar11 = uVar11 + 1;
              } while (uVar17 != uVar11);
            }
            uVar22 = uVar22 + 1;
            pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar17);
            pvVar13 = (void *)((long)pvVar13 + lVar10);
          } while (uVar22 != uVar1);
          fVar23 = (float)iVar19;
        }
        fVar25 = *(float *)((long)pvVar7 + lVar16 * 4);
        fVar26 = 0.0;
        if (fVar25 != 0.0) {
          fVar26 = 1.0 / (fVar25 * *pfVar5);
        }
        fVar26 = fVar26 * fVar23;
        if (iVar3 != 0) {
          fVar26 = fVar26 + *(float *)((long)pvVar21 + lVar16 * 4);
        }
        fVar23 = fVar26;
        switch(iVar12) {
        case 1:
          if (fVar26 <= 0.0) {
            fVar23 = 0.0;
          }
          break;
        case 2:
          fVar23 = (float)(~-(uint)(0.0 < fVar26) & (uint)*pfVar6 |
                          -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
          break;
        case 3:
          if (fVar26 <= *pfVar6) {
            fVar26 = *pfVar6;
          }
          fVar23 = fVar26;
          if (pfVar6[1] <= fVar26) {
            fVar23 = pfVar6[1];
          }
          break;
        case 4:
          fVar23 = expf(-fVar26);
          fVar23 = 1.0 / (fVar23 + 1.0);
          break;
        case 5:
          local_a8 = ZEXT416((uint)fVar26);
          fVar23 = expf(fVar26);
          fVar23 = logf(fVar23 + 1.0);
          fVar23 = tanhf(fVar23);
          fVar23 = fVar23 * (float)local_a8._0_4_;
          break;
        case 6:
          fVar25 = *pfVar6;
          fVar24 = -pfVar6[1] / fVar25;
          fVar23 = 0.0;
          if ((fVar24 <= fVar26) && (fVar23 = fVar26, fVar26 <= fVar24 + 1.0 / fVar25)) {
            fVar23 = (fVar25 * fVar26 + pfVar6[1]) * fVar26;
          }
        }
        *(float *)((long)pvVar4 + lVar16 * 4) = fVar23;
        lVar16 = lVar16 + 1;
        pvVar15 = (void *)((long)pvVar15 + (long)(int)(uVar17 * uVar1));
      } while (lVar16 != iVar18);
    }
  }
  iVar18 = 0;
LAB_001d0e40:
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if (*local_f0.refcount == 0) {
      if (local_f0.allocator == (Allocator *)0x0) {
        if (local_f0.data != (void *)0x0) {
          free(local_f0.data);
        }
      }
      else {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;
        opt_g.use_packing_layout = false;

        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_g);
    }

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const signed char* m = bottom_blob_int8.row<signed char>(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const signed char* kptr = (const signed char*)weight_data + w * p;
                int sum = 0;

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }
                // dequantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        int offset = size * channels * p;
        // channels
        for (int q = 0; q < channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + offset + size * q;
            const signed char* m = bottom_blob_int8.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
    }

    return 0;
}